

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_find_case(bson_iter_t *iter,char *key)

{
  _Bool _Var1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar4 = "iter";
    uVar3 = 0x14d;
  }
  else {
    if (key != (char *)0x0) {
      do {
        _Var1 = bson_iter_next(iter);
        if (!_Var1) {
          return _Var1;
        }
        iVar2 = bson_strcasecmp(key,(char *)(iter->raw + iter->key));
      } while (iVar2 != 0);
      return _Var1;
    }
    pcVar4 = "key";
    uVar3 = 0x14e;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar3,"bson_iter_find_case",pcVar4);
  abort();
}

Assistant:

bool
bson_iter_find_case (bson_iter_t *iter, /* INOUT */
                     const char *key)   /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (key);

   while (bson_iter_next (iter)) {
      if (!bson_strcasecmp (key, bson_iter_key (iter))) {
         return true;
      }
   }

   return false;
}